

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int time_iseasterday(void)

{
  char cVar1;
  uint uVar2;
  tm *ptVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  time_t time_data;
  time_t time_data_now;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  time(&time_data_now);
  ptVar3 = localtime(&time_data_now);
  iVar7 = ptVar3->tm_year + 0x76c;
  cVar1 = (char)(iVar7 % 100);
  iVar6 = (int)((long)iVar7 / 100);
  iVar5 = (((iVar6 + 8) / -0x19 + iVar6 + 1) / -3 + iVar7 / -400 + iVar6 + (iVar7 % 0x13) * 0x13 +
          0xf) % 0x1e;
  iVar6 = (int)(((uint)(byte)(0x20 - cVar1 % '\x04') +
                ((int)(cVar1 / '\x04') +
                (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | (long)iVar7 / 100 & 0xffffffffU)
                     % 4)) * 2) - iVar5) % 7;
  uVar2 = iVar6 * 0x16 + iVar5 * 0xb + iVar7 % 0x13;
  bVar4 = (char)iVar5 + (char)iVar6 +
          (char)((int)((uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff) / 0x1c3) * -7 +
          0x72;
  iVar6 = 1;
  for (lVar8 = -0x15180; lVar8 != 0x3f480; lVar8 = lVar8 + 0x15180) {
    time_data = time_data_now + lVar8;
    ptVar3 = localtime(&time_data);
    if ((ptVar3->tm_mon == bVar4 / 0x1f - 1) && (ptVar3->tm_mday == (uint)(byte)(bVar4 % 0x1f + 1)))
    goto LAB_0013e414;
  }
  iVar6 = 0;
LAB_0013e414:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int time_iseasterday()
{
	time_t time_data_now, time_data;
	struct tm *time_info;
	int Y, a, b, c, d, e, f, g, h, i, k, L, m, month, day, day_offset;

	time(&time_data_now);
	time_info = localtime(&time_data_now);

	// compute Easter day (Sunday) using https://en.wikipedia.org/w/index.php?title=Computus&oldid=890710285#Anonymous_Gregorian_algorithm
	Y = time_info->tm_year + 1900;
	a = Y % 19;
	b = Y / 100;
	c = Y % 100;
	d = b / 4;
	e = b % 4;
	f = (b + 8) / 25;
	g = (b - f + 1) / 3;
	h = (19 * a + b - d - g + 15) % 30;
	i = c / 4;
	k = c % 4;
	L = (32 + 2 * e + 2 * i - h - k) % 7;
	m = (a + 11 * h + 22 * L) / 451;
	month = (h + L - 7 * m + 114) / 31;
	day = ((h + L - 7 * m + 114) % 31) + 1;

	// (now-1d ≤ easter ≤ now+2d) <=> (easter-2d ≤ now ≤ easter+1d) <=> (Good Friday ≤ now ≤ Easter Monday)
	for(day_offset = -1; day_offset <= 2; day_offset++)
	{
		time_data = time_data_now + day_offset*(60*60*24);
		time_info = localtime(&time_data);

		if(time_info->tm_mon == month-1 && time_info->tm_mday == day)
			return 1;
	}
	return 0;
}